

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O2

void __thiscall
Equality_modelHHWithDifference_Test::Equality_modelHHWithDifference_Test
          (Equality_modelHHWithDifference_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_0012e950;
  return;
}

Assistant:

TEST(Equality, modelHHWithDifference)
{
    libcellml::ParserPtr parser = libcellml::Parser::create();
    libcellml::ModelPtr model = parser->parseModel(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    auto clonedModel = model->clone();

    auto v = clonedModel->component(3)->component(0)->variable(3);
    v->setUnits("millisecond");

    EXPECT_FALSE(model->equals(clonedModel));
    EXPECT_FALSE(clonedModel->equals(model));
}